

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O2

mdns_string_t mdns_string_extract(void *buffer,size_t size,size_t *offset,char *str,size_t capacity)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  ulong __n;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  mdns_string_t mVar6;
  mdns_string_pair_t local_48;
  
  sVar3 = *offset;
  sVar4 = 0xffffffffffffffff;
  __dest = str;
  sVar5 = capacity;
  do {
    mdns_get_next_substring(&local_48,buffer,size,sVar3);
    sVar2 = local_48.length;
    sVar1 = local_48.offset;
    if (local_48.offset == 0xffffffffffffffff) {
      sVar5 = 0;
LAB_0025e6c8:
      mVar6.length = sVar5;
      mVar6.str = str;
      return mVar6;
    }
    sVar3 = sVar3 + 2;
    if (sVar4 != 0xffffffffffffffff) {
      sVar3 = sVar4;
    }
    if (local_48.ref != 0) {
      sVar4 = sVar3;
    }
    if (local_48.length == 0) {
      sVar3 = local_48.offset + 1;
      if (sVar4 != 0xffffffffffffffff) {
        sVar3 = sVar4;
      }
      *offset = sVar3;
      sVar5 = capacity - sVar5;
      goto LAB_0025e6c8;
    }
    __n = sVar5;
    if (local_48.length < sVar5) {
      __n = local_48.length;
    }
    memcpy(__dest,(void *)((long)buffer + local_48.offset),__n);
    __dest = __dest + __n;
    if (sVar2 < sVar5) {
      *__dest = '.';
      __dest = __dest + 1;
      sVar5 = sVar5 + ~__n;
    }
    else {
      sVar5 = 0;
    }
    sVar3 = sVar2 + sVar1;
  } while( true );
}

Assistant:

mdns_string_t
mdns_string_extract(const void* buffer, size_t size, size_t* offset,
                    char* str, size_t capacity) {
	size_t cur = *offset;
	size_t end = MDNS_INVALID_POS;
	mdns_string_pair_t substr;
	mdns_string_t result = {str, 0};
	char* dst = str;
	size_t remain = capacity;
	do {
		substr = mdns_get_next_substring(buffer, size, cur);
		if (substr.offset == MDNS_INVALID_POS)
			return result;
		if (substr.ref && (end == MDNS_INVALID_POS))
			end = cur + 2;
		if (substr.length) {
			size_t to_copy = (substr.length < remain) ? substr.length : remain;
			memcpy(dst, (const char*)buffer + substr.offset, to_copy);
			dst += to_copy;
			remain -= to_copy;
			if (remain) {
				*dst++ = '.';
				--remain;
			}
		}
		cur = substr.offset + substr.length;
	}
	while (substr.length);

	if (end == MDNS_INVALID_POS)
		end = cur + 1;
	*offset = end;

	result.length = capacity - remain;
	return result;
}